

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbs.cc
# Opt level: O1

int CBS_stow(CBS *cbs,uint8_t **out_ptr,size_t *out_len)

{
  uint8_t *puVar1;
  
  OPENSSL_free(*out_ptr);
  *out_ptr = (uint8_t *)0x0;
  *out_len = 0;
  if (cbs->len != 0) {
    puVar1 = (uint8_t *)OPENSSL_memdup(cbs->data,cbs->len);
    *out_ptr = puVar1;
    if (puVar1 == (uint8_t *)0x0) {
      return 0;
    }
    *out_len = cbs->len;
  }
  return 1;
}

Assistant:

int CBS_stow(const CBS *cbs, uint8_t **out_ptr, size_t *out_len) {
  OPENSSL_free(*out_ptr);
  *out_ptr = NULL;
  *out_len = 0;

  if (cbs->len == 0) {
    return 1;
  }
  *out_ptr = reinterpret_cast<uint8_t *>(OPENSSL_memdup(cbs->data, cbs->len));
  if (*out_ptr == NULL) {
    return 0;
  }
  *out_len = cbs->len;
  return 1;
}